

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O0

size_t __thiscall
Logger::logless<int,double,float,unsigned_long,int,double,float,unsigned_long>
          (Logger *this,uint8_t *pUsedBuffer,int t,double ts,float ts_1,unsigned_long ts_2,int ts_3,
          double ts_4,float ts_5,unsigned_long ts_6)

{
  size_t sVar1;
  unsigned_long ts_local_6;
  float ts_local_5;
  double ts_local_4;
  int ts_local_3;
  unsigned_long ts_local_2;
  float ts_local_1;
  double ts_local;
  int t_local;
  uint8_t *pUsedBuffer_local;
  Logger *this_local;
  
  *pUsedBuffer = 0xa6;
  *(int *)(pUsedBuffer + 1) = t;
  sVar1 = logless<double,float,unsigned_long,int,double,float,unsigned_long>
                    (this,pUsedBuffer + 5,ts,ts_1,ts_2,ts_3,ts_4,ts_5,ts_6);
  return sVar1 + 5;
}

Assistant:

size_t logless(uint8_t* pUsedBuffer, T t, Ts... ts)
    {
        new (pUsedBuffer) TagType(TypeTraits<T>::type_id);
        pUsedBuffer += sizeof(TagType);
        new (pUsedBuffer) T(t);
        pUsedBuffer += sizeof(T);
        return logless(pUsedBuffer, ts...) + sizeof(TagType) + sizeof(T);
    }